

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void __thiscall
dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch
          (CFGStructurizer *this,CFGNode *dominator,CFGNode *from,CFGNode *to)

{
  uint uVar1;
  uint uVar2;
  CFGNode *pCVar3;
  CFGNode *pCVar4;
  long lVar5;
  ulong uVar6;
  Vector<CFGNode_*> *__range2;
  __node_base _Var7;
  pointer ppCVar8;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  pointer ppCVar9;
  Vector<CFGNode_*> linear_visitation_cache;
  CFGNode *n;
  UnorderedSet<CFGNode_*> visitation_cache;
  UnorderedSet<CFGNode_*> *in_stack_ffffffffffffff78;
  pointer ppCVar10;
  pointer ppCStack_80;
  CFGNode *local_70;
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if (from != to) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>
              (this,dominator,dominator,from,to,(anon_class_1_0_00000001 *)&local_68,
               in_stack_ffffffffffffff78);
    CFGNode::fixup_merge_info_after_branch_rewrite(dominator,from,to);
    ppCVar8 = (pointer)0x0;
    ppCStack_80 = (pointer)0x0;
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &stack0xffffffffffffff78,local_68._M_element_count);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var7._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        local_70 = (CFGNode *)_Var7._M_nxt[1]._M_nxt;
        if (local_70->immediate_post_dominator == from) {
          if ((local_70->fake_succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (local_70->fake_succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_70->immediate_post_dominator = (CFGNode *)0x0;
            if (ppCStack_80 == (pointer)0x0) {
              std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
              _M_realloc_insert<dxil_spv::CFGNode*const&>
                        ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                          *)&stack0xffffffffffffff78,(iterator)0x0,&local_70);
            }
            else {
              *ppCStack_80 = local_70;
              ppCStack_80 = ppCStack_80 + 1;
            }
          }
          else {
            local_70->immediate_post_dominator = to;
          }
        }
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
      } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
    }
    ppCVar10 = ppCVar8;
    if (ppCVar8 != ppCStack_80) {
      uVar6 = (long)ppCStack_80 - (long)ppCVar8 >> 3;
      lVar5 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                (ppCVar8,ppCStack_80,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppCStack_80 - (long)ppCVar8 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar8,ppCStack_80);
        ppCVar8 = ppCVar10;
        ppCVar10 = ppCVar8;
      }
      else {
        ppCVar9 = ppCVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar8,ppCVar9);
        ppCVar8 = ppCVar10;
        for (; ppCVar10 = ppCVar8, ppCVar9 != ppCStack_80; ppCVar9 = ppCVar9 + 1) {
          pCVar3 = ppCVar9[-1];
          pCVar4 = *ppCVar9;
          uVar1 = pCVar4->forward_post_visit_order;
          uVar2 = pCVar3->forward_post_visit_order;
          ppCVar10 = ppCVar9;
          while (uVar1 < uVar2) {
            *ppCVar10 = pCVar3;
            pCVar3 = ppCVar10[-2];
            ppCVar10 = ppCVar10 + -1;
            uVar2 = pCVar3->forward_post_visit_order;
          }
          *ppCVar10 = pCVar4;
        }
      }
    }
    for (; ppCVar8 != ppCStack_80; ppCVar8 = ppCVar8 + 1) {
      if ((*ppCVar8)->immediate_post_dominator == (CFGNode *)0x0) {
        CFGNode::recompute_immediate_post_dominator(*ppCVar8);
      }
    }
    CFGNode::recompute_immediate_post_dominator(dominator);
    if (ppCVar10 != (pointer)0x0) {
      free_in_thread(ppCVar10);
    }
    std::
    _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(CFGNode *dominator, CFGNode *from, CFGNode *to,
                                                                   const Op &op)
{
	if (from == to)
		return;

	UnorderedSet<CFGNode *> visitation_cache;
	traverse_dominated_blocks_and_rewrite_branch(dominator, dominator, from, to, op, visitation_cache);
	dominator->fixup_merge_info_after_branch_rewrite(from, to);

	// Force all post-domination information to be recomputed.
	Vector<CFGNode *> linear_visitation_cache;
	linear_visitation_cache.reserve(visitation_cache.size());

	for (auto *n : visitation_cache)
	{
		if (n->immediate_post_dominator == from)
		{
			if (n->fake_succ.empty())
			{
				n->immediate_post_dominator = nullptr;
				// Ignore any infinite continue blocks.
				// They wreak havoc in post-dominance analysis.
				linear_visitation_cache.push_back(n);
			}
			else
			{
				// Infinite loop blocks must not be traversed again.
				n->immediate_post_dominator = to;
			}
		}
	}

	// Will recompute everything that was cleared out.
	// Compute later nodes first. This way we avoid a potential recursive loop.
	std::sort(linear_visitation_cache.begin(), linear_visitation_cache.end(), [](const CFGNode *a, const CFGNode *b) {
		return a->forward_post_visit_order < b->forward_post_visit_order;
	});

	for (auto *n : linear_visitation_cache)
		if (!n->immediate_post_dominator)
			n->recompute_immediate_post_dominator();
	dominator->recompute_immediate_post_dominator();
}